

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.hpp
# Opt level: O0

void cov::timer::delay(time_unit unit,timer_t time)

{
  duration<long,_std::ratio<1L,_1000000000L>_> *in_RSI;
  undefined4 in_EDI;
  duration<long,std::ratio<60l,1l>> local_38 [8];
  duration<long,std::ratio<1l,1l>> local_30 [8];
  duration<long,std::ratio<1l,1000l>> local_28 [8];
  duration<long,std::ratio<1l,1000000l>> local_20 [8];
  duration<long,std::ratio<1l,1000000000l>> local_18 [8];
  
  switch(in_EDI) {
  case 0:
    std::chrono::duration<long,std::ratio<1l,1000000000l>>::duration<unsigned_long,void>
              (local_18,(unsigned_long *)&stack0xfffffffffffffff0);
    std::this_thread::sleep_for<long,std::ratio<1l,1000000000l>>(in_RSI);
    break;
  case 1:
    std::chrono::duration<long,std::ratio<1l,1000000l>>::duration<unsigned_long,void>
              (local_20,(unsigned_long *)&stack0xfffffffffffffff0);
    std::this_thread::sleep_for<long,std::ratio<1l,1000000l>>
              ((duration<long,_std::ratio<1L,_1000000L>_> *)in_RSI);
    break;
  case 2:
    std::chrono::duration<long,std::ratio<1l,1000l>>::duration<unsigned_long,void>
              (local_28,(unsigned_long *)&stack0xfffffffffffffff0);
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
              ((duration<long,_std::ratio<1L,_1000L>_> *)in_RSI);
    break;
  case 3:
    std::chrono::duration<long,std::ratio<1l,1l>>::duration<unsigned_long,void>
              (local_30,(unsigned_long *)&stack0xfffffffffffffff0);
    std::this_thread::sleep_for<long,std::ratio<1l,1l>>
              ((duration<long,_std::ratio<1L,_1L>_> *)in_RSI);
    break;
  case 4:
    std::chrono::duration<long,std::ratio<60l,1l>>::duration<unsigned_long,void>
              (local_38,(unsigned_long *)&stack0xfffffffffffffff0);
    std::this_thread::sleep_for<long,std::ratio<60l,1l>>
              ((duration<long,_std::ratio<60L,_1L>_> *)in_RSI);
  }
  return;
}

Assistant:

static void delay(time_unit unit, timer_t time)
		{
			switch (unit) {
			case time_unit::nano_sec:
				std::this_thread::sleep_for(std::chrono::nanoseconds(time));
				break;
			case time_unit::micro_sec:
				std::this_thread::sleep_for(std::chrono::microseconds(time));
				break;
			case time_unit::milli_sec:
				std::this_thread::sleep_for(std::chrono::milliseconds(time));
				break;
			case time_unit::second:
				std::this_thread::sleep_for(std::chrono::seconds(time));
				break;
			case time_unit::minute:
				std::this_thread::sleep_for(std::chrono::minutes(time));
				break;
			}
		}